

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AuxiliaryStmt *stmt)

{
  undefined1 *puVar1;
  UserException *this_00;
  ostream *poVar2;
  string_view sVar3;
  undefined1 local_88 [16];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  char local_29;
  
  if (stmt->type_ == Delay) {
    puVar1 = &(this->stream_).super_stringstream.field_0x10;
    sVar3 = indent(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,sVar3._M_str,sVar3._M_len);
    Stmt::as<kratos::EventDelayStmt>((Stmt *)local_88);
    if (*(int *)(local_88._0_8_ + 0xd8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"@(",2);
      local_78.super__Function_base._M_functor._8_8_ = (pointer)0x0;
      local_78._M_invoker =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
           ::_M_invoke;
      local_78.super__Function_base._M_manager =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
           ::_M_manager;
      local_78.super__Function_base._M_functor._M_unused._M_object = this;
      EventControl::to_string((string *)&local_50,(EventControl *)(local_88._0_8_ + 200),&local_78);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(char *)local_50._M_allocated_capacity,local_50._8_8_);
      local_29 = ')';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_allocated_capacity != &local_40) {
        operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
      }
      if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_78.super__Function_base._M_manager)
                  ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
      }
    }
    else if (*(int *)(local_88._0_8_ + 0xd8) == 0) {
      local_78.super__Function_base._M_functor._8_8_ = (pointer)0x0;
      local_78._M_invoker =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
           ::_M_invoke;
      local_78.super__Function_base._M_manager =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:985:29)>
           ::_M_manager;
      local_78.super__Function_base._M_functor._M_unused._M_object = this;
      EventControl::to_string((string *)&local_50,(EventControl *)(local_88._0_8_ + 200),&local_78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(char *)local_50._M_allocated_capacity,local_50._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_allocated_capacity != &local_40) {
        operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
      }
      if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_78.super__Function_base._M_manager)
                  ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
      }
    }
    local_50._M_local_buf[0] = ';';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,local_50._M_local_buf,1);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    local_50._M_local_buf[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_50._M_local_buf,1);
    if ((pointer)local_88._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  }
  else if (stmt->type_ == EventTracing) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_50._M_allocated_capacity = (size_type)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Auxiliary event tracing statement should not be in the codegen!"
               ,"");
    UserException::UserException(this_00,(string *)&local_50);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AuxiliaryStmt* stmt) {
    switch (stmt->aux_type()) {
        case AuxiliaryType::EventTracing: {
            throw UserException("Auxiliary event tracing statement should not be in the codegen!");
        }
        case AuxiliaryType::Delay: {
            stream_ << indent();
            auto const& delay = stmt->as<EventDelayStmt>();
            auto const& event = delay->event();
            auto var_func = [this](const Var* var) { return stream_.var_str(var); };
            switch (event.type) {
                case EventControlType::Delay: {
                    stream_ << event.to_string(var_func);
                    break;
                }
                case EventControlType::Edge: {
                    stream_ << "@(" << event.to_string(var_func) << ')';
                    break;
                }
            }
            stream_ << ';' << stream_.endl();
        }
    }
}